

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O1

unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
 __thiscall
spvtools::
MakeUnique<spvtools::opt::analysis::VectorConstant,spvtools::opt::analysis::Vector_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
          (spvtools *this,Vector **args,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *args_1)

{
  Vector *pVVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x30);
  pVVar1 = *args;
  puVar2[1] = pVVar1;
  *puVar2 = &PTR__CompositeConstant_003ef958;
  std::
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            *)(puVar2 + 2),args_1);
  *puVar2 = &PTR__CompositeConstant_003ef850;
  puVar2[5] = pVVar1->element_type_;
  *(undefined8 **)this = puVar2;
  return (__uniq_ptr_data<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}